

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzero.cpp
# Opt level: O2

Addr deref(Machine *m,Addr a)

{
  Addr AVar1;
  bool bVar2;
  Hix HVar3;
  Addr a_00;
  Machine local_158;
  Machine local_e8;
  Addr local_74;
  undefined1 local_68 [8];
  Hcell hc;
  
  hc.f_._32_8_ = a._0_8_;
  Machine::Machine(&local_158,m);
  machineAtAddr((Hcell *)local_68,&local_158,a);
  Machine::~Machine(&local_158);
  if (local_68._0_4_ == Ref) {
    local_74.hix_ = Hcell::hix((Hcell *)local_68);
    local_74.tag_ = Heap;
    local_74.r_.r = -0x2a;
    bVar2 = Addr::operator!=(&local_74,(Addr *)&hc.f_.arity);
    if (bVar2) {
      Machine::Machine(&local_e8,m);
      HVar3 = Hcell::hix((Hcell *)local_68);
      a_00.hix_.hix = HVar3.hix;
      a_00.tag_ = Heap;
      a_00.r_.r = -0x2a;
      deref(&local_e8,a_00);
      Machine::~Machine(&local_e8);
    }
  }
  AVar1.hix_.hix = a.hix_.hix.hix;
  AVar1.tag_ = hc.f_.arity;
  AVar1.r_.r = hc.f_._36_4_;
  std::__cxx11::string::~string((string *)&hc);
  return AVar1;
}

Assistant:

Addr deref(Machine m, Addr a) {
    const Hcell hc = machineAtAddr(m, a);
    // if we have a reference to chase which is not pointing to itself, then
    // chase it
    if (hc.tag == Htag::Ref && Addr(hc.hix()) != a) {
        deref(m, hc.hix());
    }
    return a;
}